

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# servak.cpp
# Opt level: O2

string * path_cat_abi_cxx11_(string_view base,string_view path)

{
  ulong in_RCX;
  long in_RDX;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RDI;
  basic_string_view local_38 [16];
  basic_string_view local_28 [16];
  
  if (in_RDX == 0) {
    boost::basic_string_view::operator_cast_to_string(in_RDI,local_38);
  }
  else {
    boost::basic_string_view::operator_cast_to_string(in_RDI,local_28);
    if ((in_RDI->_M_dataplus)._M_p[in_RDI->_M_string_length - 1] == '/') {
      std::__cxx11::string::resize((ulong)in_RDI);
    }
    std::__cxx11::string::append((char *)in_RDI,in_RCX);
  }
  return in_RDI;
}

Assistant:

std::string
path_cat(
    beast::string_view base,
    beast::string_view path)
{
    if(base.empty())
        return std::string(path);
    std::string result(base);
#ifdef BOOST_MSVC
    char constexpr path_separator = '\\';
    if(result.back() == path_separator)
        result.resize(result.size() - 1);
    result.append(path.data(), path.size());
    for(auto& c : result)
        if(c == '/')
            c = path_separator;
#else
    char constexpr path_separator = '/';
    if(result.back() == path_separator)
        result.resize(result.size() - 1);
    result.append(path.data(), path.size());
#endif
    return result;
}